

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::RegisterTypeParameterizedTestSuite
               (char *test_suite_name,CodeLocation *code_location)

{
  UnitTestImpl *pUVar1;
  CodeLocation local_50;
  
  pUVar1 = GetUnitTestImpl();
  CodeLocation::CodeLocation(&local_50,code_location);
  TypeParameterizedTestSuiteRegistry::RegisterTestSuite
            (&pUVar1->type_parameterized_test_registry_,test_suite_name,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void RegisterTypeParameterizedTestSuite(const char* test_suite_name,
                                        CodeLocation code_location) {
  GetUnitTestImpl()->type_parameterized_test_registry().RegisterTestSuite(
      test_suite_name, code_location);
}